

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

istream * nlohmann::operator>>
                    (istream *i,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  value_t vVar1;
  json_value jVar2;
  _Any_data local_e8;
  code *pcStack_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [24];
  _Any_data local_b0;
  code *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  char local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  char local_50 [64];
  
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  pcStack_d8 = (code *)0x0;
  uStack_d0 = 0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parser::parser((parser *)(local_c8 + 0x10),i,(parser_callback_t *)&local_e8);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parser::parse((parser *)local_c8);
  vVar1 = j->m_type;
  j->m_type = local_c8[0];
  jVar2 = j->m_value;
  j->m_value = (json_value)local_c8._8_8_;
  local_c8[0] = vVar1;
  local_c8._8_8_ = jVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_c8);
  if ((char *)local_60._M_allocated_capacity != local_50) {
    operator_delete((void *)local_60._M_allocated_capacity);
  }
  if ((char *)local_80._M_allocated_capacity != local_70) {
    operator_delete((void *)local_80._M_allocated_capacity);
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  if (pcStack_d8 != (code *)0x0) {
    (*pcStack_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  return i;
}

Assistant:

friend std::istream& operator>>(std::istream& i, basic_json& j)
    {
        j = parser(i).parse();
        return i;
    }